

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

RegExp * __thiscall re2c::repeat_from(re2c *this,RegExp *e,uint32_t n)

{
  re2c *this_00;
  RegExp *pRVar1;
  undefined4 in_register_00000014;
  RegExp *extraout_RDX;
  uint uVar2;
  ulong uVar3;
  pair<std::_Rb_tree_iterator<re2c::RegExp_*>,_bool> pVar4;
  RegExp *local_28;
  
  pRVar1 = (RegExp *)CONCAT44(in_register_00000014,n);
  if ((int)e == 0) {
    this_00 = (re2c *)0x0;
  }
  else {
    uVar3 = (ulong)e & 0xffffffff;
    this_00 = (re2c *)0x0;
    do {
      this_00 = (re2c *)doCat(this_00,(RegExp *)this,pRVar1);
      uVar2 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar2;
      pRVar1 = extraout_RDX;
    } while (uVar2 != 0);
  }
  pRVar1 = (RegExp *)operator_new(0x10);
  pRVar1->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015cd10;
  local_28 = pRVar1;
  pVar4 = std::
          _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
          ::_M_insert_unique<re2c::RegExp*>
                    ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
                      *)RegExp::vFreeList,&local_28);
  pRVar1->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015cb90;
  pRVar1[1]._vptr_RegExp = (_func_int **)this;
  pRVar1 = doCat(this_00,pRVar1,pVar4._8_8_);
  return pRVar1;
}

Assistant:

RegExp * repeat_from (RegExp * e, uint32_t n)
{
	RegExp * r1 = repeat (e, n);
	RegExp * r2 = new CloseOp (e);
	return doCat (r1, r2);
}